

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v5_19.c
# Opt level: O1

int can_update_sample_point_v5_19
              (can_bittiming_const *btc,uint sample_point_nominal,uint tseg,uint *tseg1_ptr,
              uint *tseg2_ptr,uint *sample_point_error_ptr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  
  uVar1 = tseg + 1;
  uVar6 = 0;
  uVar8 = 0xffffffff;
  iVar11 = 1;
  do {
    uVar2 = (tseg - (uVar1 * sample_point_nominal) / 1000) + iVar11;
    uVar3 = btc->tseg1_max;
    uVar7 = btc->tseg2_min;
    if (btc->tseg2_min < uVar2) {
      uVar7 = uVar2;
    }
    if (btc->tseg2_max <= uVar7) {
      uVar7 = btc->tseg2_max;
    }
    uVar10 = tseg - uVar7;
    uVar2 = tseg - uVar3;
    if (uVar10 <= uVar3) {
      uVar2 = uVar7;
    }
    uVar4 = (ulong)((uVar1 - uVar2) * 1000) / (ulong)uVar1;
    uVar5 = (uint)uVar4;
    uVar9 = sample_point_nominal - uVar5;
    uVar7 = -uVar9;
    if (0 < (int)uVar9) {
      uVar7 = uVar9;
    }
    if (uVar7 < uVar8 && uVar5 <= sample_point_nominal) {
      if (uVar10 < uVar3) {
        uVar3 = uVar10;
      }
      *tseg1_ptr = uVar3;
      *tseg2_ptr = uVar2;
      uVar6 = uVar4;
      uVar8 = uVar7;
    }
    iVar11 = iVar11 + -1;
  } while (iVar11 == 0);
  if (sample_point_error_ptr != (uint *)0x0) {
    *sample_point_error_ptr = uVar8;
  }
  return (int)uVar6;
}

Assistant:

static int
can_update_sample_point(const struct can_bittiming_const *btc,
			const unsigned int sample_point_nominal, const unsigned int tseg,
			unsigned int *tseg1_ptr, unsigned int *tseg2_ptr,
			unsigned int *sample_point_error_ptr)
{
	unsigned int sample_point_error, best_sample_point_error = UINT_MAX;
	unsigned int sample_point, best_sample_point = 0;
	unsigned int tseg1, tseg2;
	int i;

	for (i = 0; i <= 1; i++) {
		tseg2 = tseg + CAN_SYNC_SEG -
			(sample_point_nominal * (tseg + CAN_SYNC_SEG)) /
			1000 - i;
		tseg2 = clamp(tseg2, btc->tseg2_min, btc->tseg2_max);
		tseg1 = tseg - tseg2;
		if (tseg1 > btc->tseg1_max) {
			tseg1 = btc->tseg1_max;
			tseg2 = tseg - tseg1;
		}

		sample_point = 1000 * (tseg + CAN_SYNC_SEG - tseg2) /
			(tseg + CAN_SYNC_SEG);
		sample_point_error = abs(sample_point_nominal - sample_point);

		if (sample_point <= sample_point_nominal &&
		    sample_point_error < best_sample_point_error) {
			best_sample_point = sample_point;
			best_sample_point_error = sample_point_error;
			*tseg1_ptr = tseg1;
			*tseg2_ptr = tseg2;
		}
	}

	if (sample_point_error_ptr)
		*sample_point_error_ptr = best_sample_point_error;

	return best_sample_point;
}